

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

bool __thiscall Parser::match(Parser *this,string *token)

{
  __type_conflict _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  skip_whitespace(this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_40,&this->expr,this->pos,token->_M_string_length);
  _Var1 = std::operator==(&local_40,token);
  std::__cxx11::string::~string((string *)&local_40);
  if (_Var1) {
    this->pos = this->pos + token->_M_string_length;
    skip_whitespace(this);
  }
  return _Var1;
}

Assistant:

bool match( const std::string & token )
  {
    skip_whitespace();
    if ( expr.substr( pos, token.length() ) == token )
    {
      pos += token.length();
      skip_whitespace();
      return true;
    }
    return false;
  }